

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O3

bool __thiscall
BamTools::ResolveTool::StatsFileReader::ParseOptionLine
          (StatsFileReader *this,string *line,ResolveSettings *settings)

{
  size_t __n;
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  stringstream value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  stringstream local_1a8 [128];
  ios_base local_128 [264];
  
  Utilities::Split(&local_1c0,line,'=');
  if ((long)local_1c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x40) {
    bVar3 = false;
    goto LAB_00168972;
  }
  std::__cxx11::stringstream::stringstream
            (local_1a8,
             (string *)
             (local_1c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),_S_out|_S_in);
  __n = (local_1c0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  if (__n == OPTION_CONFIDENCEINTERVAL_abi_cxx11_._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp(((local_1c0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                   OPTION_CONFIDENCEINTERVAL_abi_cxx11_._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_00168803;
    }
    std::istream::_M_extract<double>((double *)local_1a8);
    settings->HasConfidenceInterval = true;
LAB_00168951:
    bVar3 = true;
  }
  else {
LAB_00168803:
    if (__n != OPTION_FORCEMARKREADGROUPS_abi_cxx11_._M_string_length) {
LAB_0016882f:
      if (__n == OPTION_MINIMUMMAPQUALITY_abi_cxx11_._M_string_length) {
        if (__n != 0) {
          iVar1 = bcmp(((local_1c0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                       OPTION_MINIMUMMAPQUALITY_abi_cxx11_._M_dataplus._M_p,__n);
          if (iVar1 != 0) goto LAB_0016885b;
        }
        std::istream::_M_extract<unsigned_short>((ushort *)local_1a8);
        settings->HasMinimumMapQuality = true;
      }
      else {
LAB_0016885b:
        if (__n != OPTION_UNUSEDMODELTHRESHOLD_abi_cxx11_._M_string_length) {
LAB_00168887:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"bamtools resolve ERROR - unrecognized option: ",0x2e);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,
                              ((local_1c0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                              (local_1c0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," in stats file",0xe);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          bVar3 = false;
          goto LAB_00168954;
        }
        if (__n != 0) {
          iVar1 = bcmp(((local_1c0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                       OPTION_UNUSEDMODELTHRESHOLD_abi_cxx11_._M_dataplus._M_p,__n);
          if (iVar1 != 0) goto LAB_00168887;
        }
        std::istream::_M_extract<double>((double *)local_1a8);
        settings->HasUnusedModelThreshold = true;
      }
      goto LAB_00168951;
    }
    if (__n != 0) {
      iVar1 = bcmp(((local_1c0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                   OPTION_FORCEMARKREADGROUPS_abi_cxx11_._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_0016882f;
    }
    bVar3 = true;
    std::istream::_M_extract<bool>((bool *)local_1a8);
  }
LAB_00168954:
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
LAB_00168972:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  return bVar3;
}

Assistant:

bool ResolveTool::StatsFileReader::ParseOptionLine(const std::string& line,
                                                   ResolveTool::ResolveSettings* settings)
{
    // split line into option, value
    std::vector<std::string> fields = Utilities::Split(line, EQUAL_CHAR);
    if (fields.size() != NUM_OPTIONS_FIELDS) return false;
    const std::string& option = fields.at(0);
    std::stringstream value(fields.at(1));

    // -----------------------------------
    // handle option based on keyword

    // ConfidenceInterval
    if (option == OPTION_CONFIDENCEINTERVAL) {
        value >> settings->ConfidenceInterval;
        settings->HasConfidenceInterval = true;
        return true;
    }

    // ForceMarkReadGroups
    if (option == OPTION_FORCEMARKREADGROUPS) {
        value >> settings->HasForceMarkReadGroups;
        return true;
    }

    // MinimumMapQuality
    if (option == OPTION_MINIMUMMAPQUALITY) {
        value >> settings->MinimumMapQuality;
        settings->HasMinimumMapQuality = true;
        return true;
    }

    // UnusedModelThreshold
    if (option == OPTION_UNUSEDMODELTHRESHOLD) {
        value >> settings->UnusedModelThreshold;
        settings->HasUnusedModelThreshold = true;
        return true;
    }

    // otherwise unknown option
    std::cerr << "bamtools resolve ERROR - unrecognized option: " << option << " in stats file"
              << std::endl;
    return false;
}